

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZThreadPool.cpp
# Opt level: O2

void __thiscall TPZThreadPool::run(TPZThreadPool *this,TPZAutoPointer<TPZReschedulableTask> *task)

{
  int iVar1;
  TPZAutoPointer<TPZTask> tpztask;
  unique_lock<std::mutex> lock;
  shared_future<void> local_68;
  TPZAutoPointer<TPZReschedulableTask> local_50;
  unique_lock<std::mutex> local_48;
  packaged_task<void_()> local_38;
  
  std::unique_lock<std::mutex>::unique_lock(&local_48,(mutex_type *)(*(long *)task->fRef + 0x28));
  if (*(int *)(*(long *)task->fRef + 0x10) == 0) {
    std::packaged_task<void_()>::get_future(&local_38);
    local_68.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(local_38._M_state.
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->super__State_base;
    local_68.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_38._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    local_38._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_38._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::shared_future<void>::operator=
              ((shared_future<void> *)(*(long *)task->fRef + 0x50),&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    iVar1 = threadCount(this);
    if (iVar1 == 0) {
      (**(code **)(**(long **)task->fRef + 0x20))();
      std::condition_variable::notify_all();
    }
    else {
      local_50 = (TPZAutoPointer<TPZReschedulableTask>)task->fRef;
      LOCK();
      *(int *)(local_50.fRef + 8) = *(int *)(local_50.fRef + 8) + 1;
      UNLOCK();
      TPZAutoPointerDynamicCast<TPZTask,TPZReschedulableTask>
                ((TPZAutoPointer<TPZReschedulableTask> *)&local_68);
      TPZAutoPointer<TPZReschedulableTask>::~TPZAutoPointer(&local_50);
      appendTaskToQueue(this,(TPZAutoPointer<TPZTask> *)&local_68);
      *(undefined4 *)(*(long *)task->fRef + 0x10) = 1;
      TPZAutoPointer<TPZTask>::~TPZAutoPointer((TPZAutoPointer<TPZTask> *)&local_68);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void TPZThreadPool::run(TPZAutoPointer<TPZReschedulableTask> &task) {
    std::unique_lock<std::mutex> lock(task->mStateMutex);
    switch (task->mState) {
        case TPZReschedulableTask::EProcessingState::CREATED:
        {
            task->mFuture = task->mTask->get_future().share();
            if (threadCount() != 0) {
                TPZAutoPointer<TPZTask> tpztask = TPZAutoPointerDynamicCast<TPZTask>(task);
                appendTaskToQueue(tpztask);
                task->mState = TPZReschedulableTask::EProcessingState::SCHEDULED;
            } else {
                task->startInternal();
                task->mCondition.notify_all();
            }
            break;
        }
        case TPZReschedulableTask::EProcessingState::SCHEDULED:
        case TPZReschedulableTask::EProcessingState::STARTED:
        case TPZReschedulableTask::EProcessingState::FINISHED:
            break;
    }
}